

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int ecp_double_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *P,mbedtls_mpi *tmp
                  )

{
  mbedtls_mpi *X;
  mbedtls_mpi *X_00;
  mbedtls_mpi *A;
  int iVar1;
  mbedtls_ecp_point *c;
  mbedtls_mpi *pmVar2;
  size_t count;
  size_t count_00;
  size_t count_01;
  size_t count_02;
  
  X = tmp + 1;
  if ((grp->A).p == (mbedtls_mpi_uint *)0x0) {
    iVar1 = mbedtls_mpi_mul_mod(grp,X,&P->Z,&P->Z);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_add_mod(grp,tmp + 2,&P->X,X);
    if (iVar1 != 0) {
      return iVar1;
    }
    pmVar2 = tmp + 3;
    iVar1 = mbedtls_mpi_sub_mod(grp,pmVar2,&P->X,X);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_mul_mod(grp,X,tmp + 2,pmVar2);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_mul_int_mod(grp,tmp,X,(mbedtls_mpi_uint)pmVar2);
  }
  else {
    c = P;
    iVar1 = mbedtls_mpi_mul_mod(grp,X,&P->X,&P->X);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_mul_int_mod(grp,tmp,X,(mbedtls_mpi_uint)c);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_cmp_int(&grp->A,0);
    if (iVar1 == 0) goto LAB_001a181d;
    iVar1 = mbedtls_mpi_mul_mod(grp,X,&P->Z,&P->Z);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_mul_mod(grp,tmp + 2,X,X);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_mul_mod(grp,X,tmp + 2,&grp->A);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_add_mod(grp,tmp,tmp,X);
  }
  if (iVar1 != 0) {
    return iVar1;
  }
LAB_001a181d:
  pmVar2 = tmp + 2;
  A = &P->Y;
  iVar1 = mbedtls_mpi_mul_mod(grp,pmVar2,A,A);
  if ((((iVar1 == 0) && (iVar1 = mbedtls_mpi_shift_l_mod(grp,pmVar2,count), iVar1 == 0)) &&
      (iVar1 = mbedtls_mpi_mul_mod(grp,X,&P->X,pmVar2), iVar1 == 0)) &&
     (iVar1 = mbedtls_mpi_shift_l_mod(grp,X,count_00), iVar1 == 0)) {
    X_00 = tmp + 3;
    iVar1 = mbedtls_mpi_mul_mod(grp,X_00,pmVar2,pmVar2);
    if ((((iVar1 == 0) && (iVar1 = mbedtls_mpi_shift_l_mod(grp,X_00,count_01), iVar1 == 0)) &&
        ((iVar1 = mbedtls_mpi_mul_mod(grp,pmVar2,tmp,tmp), iVar1 == 0 &&
         ((iVar1 = mbedtls_mpi_sub_mod(grp,pmVar2,pmVar2,X), iVar1 == 0 &&
          (iVar1 = mbedtls_mpi_sub_mod(grp,pmVar2,pmVar2,X), iVar1 == 0)))))) &&
       ((iVar1 = mbedtls_mpi_sub_mod(grp,X,X,pmVar2), iVar1 == 0 &&
        (((((iVar1 = mbedtls_mpi_mul_mod(grp,X,X,tmp), iVar1 == 0 &&
            (iVar1 = mbedtls_mpi_sub_mod(grp,X,X,X_00), iVar1 == 0)) &&
           (iVar1 = mbedtls_mpi_mul_mod(grp,X_00,A,&P->Z), iVar1 == 0)) &&
          ((iVar1 = mbedtls_mpi_shift_l_mod(grp,X_00,count_02), iVar1 == 0 &&
           (iVar1 = mbedtls_mpi_copy(&R->X,pmVar2), iVar1 == 0)))) &&
         (iVar1 = mbedtls_mpi_copy(&R->Y,X), iVar1 == 0)))))) {
      iVar1 = mbedtls_mpi_copy(&R->Z,X_00);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int ecp_double_jac(const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                          const mbedtls_ecp_point *P,
                          mbedtls_mpi tmp[4])
{
#if defined(MBEDTLS_SELF_TEST)
    dbl_count++;
#endif

#if defined(MBEDTLS_ECP_DOUBLE_JAC_ALT)
    if (mbedtls_internal_ecp_grp_capable(grp)) {
        return mbedtls_internal_ecp_double_jac(grp, R, P);
    }
#endif /* MBEDTLS_ECP_DOUBLE_JAC_ALT */

#if defined(MBEDTLS_ECP_NO_FALLBACK) && defined(MBEDTLS_ECP_DOUBLE_JAC_ALT)
    return MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
#else
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /* Special case for A = -3 */
    if (mbedtls_ecp_group_a_is_minus_3(grp)) {
        /* tmp[0] <- M = 3(X + Z^2)(X - Z^2) */
        MPI_ECP_SQR(&tmp[1],  &P->Z);
        MPI_ECP_ADD(&tmp[2],  &P->X,  &tmp[1]);
        MPI_ECP_SUB(&tmp[3],  &P->X,  &tmp[1]);
        MPI_ECP_MUL(&tmp[1],  &tmp[2],     &tmp[3]);
        MPI_ECP_MUL_INT(&tmp[0],  &tmp[1],     3);
    } else {
        /* tmp[0] <- M = 3.X^2 + A.Z^4 */
        MPI_ECP_SQR(&tmp[1],  &P->X);
        MPI_ECP_MUL_INT(&tmp[0],  &tmp[1],  3);

        /* Optimize away for "koblitz" curves with A = 0 */
        if (MPI_ECP_CMP_INT(&grp->A, 0) != 0) {
            /* M += A.Z^4 */
            MPI_ECP_SQR(&tmp[1],  &P->Z);
            MPI_ECP_SQR(&tmp[2],  &tmp[1]);
            MPI_ECP_MUL(&tmp[1],  &tmp[2],     &grp->A);
            MPI_ECP_ADD(&tmp[0],  &tmp[0],     &tmp[1]);
        }
    }

    /* tmp[1] <- S = 4.X.Y^2 */
    MPI_ECP_SQR(&tmp[2],  &P->Y);
    MPI_ECP_SHIFT_L(&tmp[2],  1);
    MPI_ECP_MUL(&tmp[1],  &P->X, &tmp[2]);
    MPI_ECP_SHIFT_L(&tmp[1],  1);

    /* tmp[3] <- U = 8.Y^4 */
    MPI_ECP_SQR(&tmp[3],  &tmp[2]);
    MPI_ECP_SHIFT_L(&tmp[3],  1);

    /* tmp[2] <- T = M^2 - 2.S */
    MPI_ECP_SQR(&tmp[2],  &tmp[0]);
    MPI_ECP_SUB(&tmp[2],  &tmp[2], &tmp[1]);
    MPI_ECP_SUB(&tmp[2],  &tmp[2], &tmp[1]);

    /* tmp[1] <- S = M(S - T) - U */
    MPI_ECP_SUB(&tmp[1],  &tmp[1],     &tmp[2]);
    MPI_ECP_MUL(&tmp[1],  &tmp[1],     &tmp[0]);
    MPI_ECP_SUB(&tmp[1],  &tmp[1],     &tmp[3]);

    /* tmp[3] <- U = 2.Y.Z */
    MPI_ECP_MUL(&tmp[3],  &P->Y,  &P->Z);
    MPI_ECP_SHIFT_L(&tmp[3],  1);

    /* Store results */
    MPI_ECP_MOV(&R->X, &tmp[2]);
    MPI_ECP_MOV(&R->Y, &tmp[1]);
    MPI_ECP_MOV(&R->Z, &tmp[3]);

cleanup:

    return ret;
#endif /* !defined(MBEDTLS_ECP_NO_FALLBACK) || !defined(MBEDTLS_ECP_DOUBLE_JAC_ALT) */
}